

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O1

SSL_SESSION * d2i_SSL_SESSION(SSL_SESSION **a,uchar **pp,long length)

{
  _Head_base<0UL,_ssl_session_st_*,_false> _Var1;
  UniquePtr<SSL_SESSION> ret;
  CBS cbs;
  _Head_base<0UL,_ssl_session_st_*,_false> local_38;
  CBS local_30;
  
  if (length < 0) {
    _Var1._M_head_impl = (ssl_session_st *)0x0;
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                  ,0x339);
  }
  else {
    local_30.data = *pp;
    _Var1._M_head_impl = (ssl_session_st *)0x0;
    local_30.len = length;
    bssl::SSL_SESSION_parse
              ((bssl *)&local_38,&local_30,(SSL_X509_METHOD *)bssl::ssl_crypto_x509_method,
               (CRYPTO_BUFFER_POOL *)0x0);
    if ((SSL_SESSION *)local_38._M_head_impl != (SSL_SESSION *)0x0) {
      if (a != (SSL_SESSION **)0x0) {
        SSL_SESSION_free(*a);
        *a = (SSL_SESSION *)local_38._M_head_impl;
      }
      _Var1._M_head_impl = local_38._M_head_impl;
      *pp = local_30.data;
      local_38._M_head_impl = (ssl_session_st *)0x0;
    }
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_38);
  }
  return (SSL_SESSION *)_Var1._M_head_impl;
}

Assistant:

SSL_SESSION *d2i_SSL_SESSION(SSL_SESSION **a, const uint8_t **pp, long length) {
  if (length < 0) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return NULL;
  }

  CBS cbs;
  CBS_init(&cbs, *pp, length);

  UniquePtr<SSL_SESSION> ret = SSL_SESSION_parse(&cbs, &ssl_crypto_x509_method,
                                                 NULL /* no buffer pool */);
  if (!ret) {
    return NULL;
  }

  if (a) {
    SSL_SESSION_free(*a);
    *a = ret.get();
  }
  *pp = CBS_data(&cbs);
  return ret.release();
}